

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

int adj_lev(d_level *dlev,permonst *ptr)

{
  xchar xVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  
  if (ptr != mons + 0x128) {
    iVar6 = (int)ptr->mlevel;
    iVar3 = 0x32;
    if (iVar6 < 0x32) {
      xVar1 = level_difficulty(dlev);
      uVar5 = (int)xVar1 - (int)ptr->mlevel;
      if ((int)uVar5 < 0) {
        iVar6 = iVar6 + -1;
      }
      else {
        iVar6 = iVar6 + (uVar5 & 0xff) / 5;
      }
      sVar4 = ptr->mlevel * 3;
      sVar2 = (short)((uint)(int)(short)(sVar4 - (sVar4 >> 0xf)) >> 1);
      sVar4 = 0x31;
      if (sVar2 < 0x31) {
        sVar4 = sVar2;
      }
      iVar3 = 0;
      if (0 < iVar6) {
        iVar3 = iVar6;
      }
      if (sVar4 < iVar6) {
        iVar3 = (int)sVar4;
      }
    }
    return iVar3;
  }
  uVar5 = 0x31;
  if (mvitals[0x128].died + 0x1e < 0x31) {
    uVar5 = mvitals[0x128].died + 0x1e;
  }
  return uVar5;
}

Assistant:

int adj_lev(const d_level *dlev, const struct permonst *ptr)
{
	int	tmp, tmp2;

	if (ptr == &mons[PM_WIZARD_OF_YENDOR]) {
		/* does not depend on other strengths, but does get stronger
		 * every time he is killed
		 */
		tmp = ptr->mlevel + mvitals[PM_WIZARD_OF_YENDOR].died;
		if (tmp > 49) tmp = 49;
		return tmp;
	}

	if (ptr->mlevel > 49) return 50; /* "special" demons/devils */
	tmp = ptr->mlevel;
	tmp2 = level_difficulty(dlev) - ptr->mlevel;
	if (tmp2 < 0) tmp--;		/* if mlevel > u.uz decrement tmp */
	else tmp += (tmp2 / 5);		/* else increment 1 per five diff */

	tmp2 = (3 * ptr->mlevel)/ 2;	/* crude upper limit */
	if (tmp2 > 49) tmp2 = 49;		/* hard upper limit */
	return (tmp > tmp2) ? tmp2 : (tmp > 0 ? tmp : 0); /* 0 lower limit */
}